

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void kratos::Enum::verify_naming_conflict
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
                *enums,string *name,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *values)

{
  long lVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  mapped_type *ppEVar4;
  UserException *pUVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar6;
  _Rb_tree_header *p_Var7;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  size_t local_168;
  pointer pcStack_160;
  pointer local_158;
  size_type sStack_150;
  undefined1 local_148 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  used_names;
  undefined1 auStack_f8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_c0 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Enum_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Enum_*>_>_>
  name_mapping;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  overlap;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> used_name;
  
  used_name.field_2._8_8_ =
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
       ::find(&enums->_M_t,name);
  if ((_Rb_tree_header *)used_name.field_2._8_8_ != &(enums->_M_t)._M_impl.super__Rb_tree_header) {
    pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
    auStack_f8 = (undefined1  [8])(name->_M_dataplus)._M_p;
    names._M_t._M_impl._0_8_ = name->_M_string_length;
    format_str.size_ = 0xd;
    format_str.data_ = (char *)0x1b;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_f8;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_c0,(detail *)"{0} already exists in scope",format_str,args);
    UserException::UserException(pUVar5,(string *)local_c0);
    __cxa_throw(pUVar5,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&names;
  names._M_t._M_impl._0_8_ = (ulong)(uint)names._M_t._M_impl._4_4_ << 0x20;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  names._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&used_names;
  used_names._M_t._M_impl._0_4_ = 0;
  used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  used_names._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var2 = (values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(values->_M_t)._M_impl.super__Rb_tree_header;
  used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((_Rb_tree_header *)p_Var2 != p_Var7) {
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_emplace_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)auStack_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1));
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var7);
  }
  local_c0 = (undefined1  [8])&name_mapping._M_h._M_rehash_policy._M_next_resize;
  name_mapping._M_h._M_buckets = (__buckets_ptr)0x1;
  name_mapping._M_h._M_bucket_count = 0;
  name_mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  name_mapping._M_h._M_element_count._0_4_ = 0x3f800000;
  name_mapping._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  name_mapping._M_h._M_rehash_policy._4_4_ = 0;
  name_mapping._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var2 = (enums->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var2 != (_Base_ptr)used_name.field_2._8_8_) {
    do {
      lVar1 = *(long *)(p_Var2 + 2);
      for (p_Var3 = *(_Rb_tree_node_base **)(lVar1 + 0x28);
          p_Var3 != (_Rb_tree_node_base *)(lVar1 + 0x18);
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_emplace_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1)
                  );
        name_mapping._M_h._M_single_bucket = *(__node_base_ptr *)(p_Var2 + 2);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Enum*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Enum*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string_const&,kratos::Enum*>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Enum*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Enum*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_c0,p_Var3 + 1,&name_mapping._M_h._M_single_bucket);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != (_Base_ptr)used_name.field_2._8_8_);
  }
  aVar6.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &overlap;
  overlap._M_t._M_impl._0_4_ = 0;
  overlap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  overlap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  overlap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  overlap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)aVar6.values_;
  overlap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)aVar6.values_;
  std::
  __set_intersection<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::insert_iterator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,&names,
             used_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,&used_names,
             &name_mapping._M_h._M_single_bucket);
  if (overlap._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
    overlap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&used_name._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&overlap._M_t._M_impl.super__Rb_tree_header._M_node_count,
               *(long *)(overlap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 1),
               (long)&(overlap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[1]._M_parent)
                      ->_M_color +
               *(long *)(overlap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 1));
    ppEVar4 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Enum_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Enum_*>_>_>
              ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Enum_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Enum_*>_>_>
                    *)local_c0,(key_type *)&overlap._M_t._M_impl.super__Rb_tree_header._M_node_count
                  );
    pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
    local_158 = ((*ppEVar4)->name)._M_dataplus._M_p;
    sStack_150 = ((*ppEVar4)->name)._M_string_length;
    local_168 = overlap._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pcStack_160 = used_name._M_dataplus._M_p;
    format_str_00.size_ = 0xdd;
    format_str_00.data_ = (char *)0x1c;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar6.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_168;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)&used_names._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (detail *)"{0} has been used in {1}.{0}",format_str_00,args_00);
    UserException::UserException
              (pUVar5,(string *)&used_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __cxa_throw(pUVar5,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&name_mapping._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Enum_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Enum_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Enum_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Enum_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_148);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_f8);
  return;
}

Assistant:

void Enum::verify_naming_conflict(const std::map<std::string, std::shared_ptr<Enum>> &enums,
                                  const std::string &name,
                                  const std::map<std::string, uint64_t> &values) {
    if (enums.find(name) != enums.end())
        throw UserException(::format("{0} already exists in scope", name));
    // check name conflicts
    std::set<std::string> names;
    std::set<std::string> used_names;
    for (auto const &iter : values) {
        names.emplace(iter.first);
    }
    // find all enum definition used in the generator
    // name mapping
    std::unordered_map<std::string, Enum *> name_mapping;
    for (auto const &iter : enums) {
        auto const &enum_ = iter.second;
        auto const &values_ = enum_->values;
        for (auto const &iter2 : values_) {
            used_names.emplace(iter2.first);
            name_mapping.emplace(iter2.first, enum_.get());
        }
    }
    // if there is an overlap/intersection
    std::set<std::string> overlap;
    std::set_intersection(names.begin(), names.end(), used_names.begin(), used_names.end(),
                          std::inserter(overlap, overlap.begin()));
    if (!overlap.empty()) {
        // pick a random one, don't care
        auto used_name = *overlap.begin();
        auto const &enum_def = name_mapping.at(used_name);
        throw UserException(::format("{0} has been used in {1}.{0}", used_name, enum_def->name));
    }
}